

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3UpdateDocTotals(int *pRC,Fts3Table *p,u32 *aSzIns,u32 *aSzDel,int nChng)

{
  int iVar1;
  int iVar2;
  u32 *a;
  u32 uVar3;
  sqlite3_stmt *pStmt_00;
  long lVar4;
  u32 uVar5;
  undefined4 in_register_00000084;
  long lVar6;
  int j;
  int iVar7;
  sqlite3_stmt *pStmt;
  int nBlob;
  void *local_58;
  sqlite3_stmt *local_50;
  u32 *local_48;
  u32 *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000084,nChng);
  if (*pRC == 0) {
    lVar4 = (long)p->nColumn + 2;
    a = (u32 *)sqlite3_malloc64(lVar4 * 0xe);
    if (a == (u32 *)0x0) {
      *pRC = 7;
    }
    else {
      local_40 = aSzIns;
      iVar1 = fts3SqlStmt(p,0x16,&pStmt,(sqlite3_value **)0x0);
      pStmt_00 = pStmt;
      if (iVar1 == 0) {
        local_48 = aSzDel;
        sqlite3_bind_int64(pStmt,1,0);
        iVar1 = sqlite3_step(pStmt_00);
        if (iVar1 == 100) {
          lVar6 = 0;
          local_58 = sqlite3_column_blob(pStmt_00,0);
          local_50 = pStmt_00;
          iVar1 = sqlite3_column_bytes(pStmt_00,0);
          if (iVar1 != 0) {
            iVar7 = 0;
            if (*(char *)((long)local_58 + (long)iVar1 + -1) < '\0') {
              lVar6 = 0;
            }
            else {
              lVar6 = 0;
              for (; (lVar6 < lVar4 && (iVar7 < iVar1)); iVar7 = iVar7 + iVar2) {
                iVar2 = sqlite3Fts3GetVarint
                                  ((char *)((long)iVar7 + (long)local_58),(sqlite_int64 *)&nBlob);
                a[lVar6] = nBlob;
                lVar6 = lVar6 + 1;
              }
            }
          }
          for (; pStmt_00 = local_50, lVar6 < lVar4; lVar6 = lVar6 + 1) {
            a[lVar6] = 0;
          }
        }
        else {
          memset(a,0,lVar4 * 4);
        }
        iVar1 = sqlite3_reset(pStmt_00);
        if (iVar1 == 0) {
          iVar1 = (int)local_38;
          uVar5 = *a + iVar1;
          uVar3 = uVar5;
          if (*a < (uint)-iVar1) {
            uVar3 = 0;
          }
          if (-1 < iVar1) {
            uVar3 = uVar5;
          }
          *a = uVar3;
          for (lVar6 = 0; lVar6 <= p->nColumn; lVar6 = lVar6 + 1) {
            uVar3 = (local_40[lVar6] + a[lVar6 + 1]) - local_48[lVar6];
            if (local_40[lVar6] + a[lVar6 + 1] < local_48[lVar6]) {
              uVar3 = 0;
            }
            a[lVar6 + 1] = uVar3;
          }
          fts3EncodeIntArray((int)lVar4,a,(char *)(a + lVar4),&nBlob);
          iVar1 = fts3SqlStmt(p,0x17,&pStmt,(sqlite3_value **)0x0);
          if (iVar1 == 0) {
            sqlite3_bind_int64(pStmt,1,0);
            sqlite3_bind_blob(pStmt,2,a + lVar4,nBlob,(_func_void_void_ptr *)0x0);
            sqlite3_step(pStmt);
            iVar1 = sqlite3_reset(pStmt);
            *pRC = iVar1;
            sqlite3_bind_null(pStmt,2);
            sqlite3_free(a);
            return;
          }
        }
      }
      sqlite3_free(a);
      *pRC = iVar1;
    }
  }
  return;
}

Assistant:

static void fts3UpdateDocTotals(
  int *pRC,                       /* The result code */
  Fts3Table *p,                   /* Table being updated */
  u32 *aSzIns,                    /* Size increases */
  u32 *aSzDel,                    /* Size decreases */
  int nChng                       /* Change in the number of documents */
){
  char *pBlob;             /* Storage for BLOB written into %_stat */
  int nBlob;               /* Size of BLOB written into %_stat */
  u32 *a;                  /* Array of integers that becomes the BLOB */
  sqlite3_stmt *pStmt;     /* Statement for reading and writing */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subfunctions */

  const int nStat = p->nColumn+2;

  if( *pRC ) return;
  a = sqlite3_malloc64( (sizeof(u32)+10)*(sqlite3_int64)nStat );
  if( a==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  pBlob = (char*)&a[nStat];
  rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  if( sqlite3_step(pStmt)==SQLITE_ROW ){
    fts3DecodeIntArray(nStat, a,
         sqlite3_column_blob(pStmt, 0),
         sqlite3_column_bytes(pStmt, 0));
  }else{
    memset(a, 0, sizeof(u32)*(nStat) );
  }
  rc = sqlite3_reset(pStmt);
  if( rc!=SQLITE_OK ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  if( nChng<0 && a[0]<(u32)(-nChng) ){
    a[0] = 0;
  }else{
    a[0] += nChng;
  }
  for(i=0; i<p->nColumn+1; i++){
    u32 x = a[i+1];
    if( x+aSzIns[i] < aSzDel[i] ){
      x = 0;
    }else{
      x = x + aSzIns[i] - aSzDel[i];
    }
    a[i+1] = x;
  }
  fts3EncodeIntArray(nStat, a, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, SQLITE_STATIC);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
  sqlite3_bind_null(pStmt, 2);
  sqlite3_free(a);
}